

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

int Curl_wait_ms(timediff_t timeout_ms)

{
  int iVar1;
  timeval *__timeout;
  int *piVar2;
  timeval pending_tv;
  timeval local_10;
  
  if (timeout_ms == 0) {
    return 0;
  }
  if (timeout_ms < 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    __timeout = curlx_mstotv(&local_10,timeout_ms);
    iVar1 = select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)__timeout);
    if (iVar1 == 0) {
      return 0;
    }
    if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 == 4)) {
      return 0;
    }
  }
  return -1;
}

Assistant:

int Curl_wait_ms(timediff_t timeout_ms)
{
  int r = 0;

  if(!timeout_ms)
    return 0;
  if(timeout_ms < 0) {
    SET_SOCKERRNO(SOCKEINVAL);
    return -1;
  }
#if defined(MSDOS)
  delay((unsigned int)timeout_ms);
#elif defined(_WIN32)
  /* prevent overflow, timeout_ms is typecast to ULONG/DWORD. */
#if TIMEDIFF_T_MAX >= ULONG_MAX
  if(timeout_ms >= ULONG_MAX)
    timeout_ms = ULONG_MAX-1;
    /* do not use ULONG_MAX, because that is equal to INFINITE */
#endif
  Sleep((DWORD)timeout_ms);
#else
  /* avoid using poll() for this since it behaves incorrectly with no sockets
     on Apple operating systems */
  {
    struct timeval pending_tv;
    r = select(0, NULL, NULL, NULL, curlx_mstotv(&pending_tv, timeout_ms));
  }
#endif /* _WIN32 */
  if(r) {
    if((r == -1) && (SOCKERRNO == SOCKEINTR))
      /* make EINTR from select or poll not a "lethal" error */
      r = 0;
    else
      r = -1;
  }
  return r;
}